

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testFutureProofing.cpp
# Opt level: O2

bool anon_unknown.dwarf_183ce9::checkPixels<unsigned_int>
               (Array2D<unsigned_int> *sampleCount,Array2D<unsigned_int_*> *ph,int lx,int rx,int ly,
               int ry,int width)

{
  long lVar1;
  long lVar2;
  ostream *poVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  
  lVar5 = (long)ly;
  do {
    if (ry < lVar5) {
LAB_0015ffe6:
      return ry < lVar5;
    }
    for (lVar6 = (long)lx; lVar6 <= rx; lVar6 = lVar6 + 1) {
      uVar4 = ((int)lVar6 + (int)lVar5 * width) % 0x801;
      lVar2 = -1;
      while (lVar2 - (ulong)sampleCount->_data[sampleCount->_sizeY * lVar5 + lVar6] != -1) {
        lVar1 = lVar2 + 1;
        lVar2 = lVar2 + 1;
        if (ph->_data[ph->_sizeY * lVar5 + lVar6][lVar1] != uVar4) {
          poVar3 = std::operator<<((ostream *)&std::cout,"value at ");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,(int)lVar6);
          poVar3 = std::operator<<(poVar3,", ");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,(int)lVar5);
          poVar3 = std::operator<<(poVar3,", sample ");
          poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
          poVar3 = std::operator<<(poVar3,": ");
          poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
          poVar3 = std::operator<<(poVar3,", should be ");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar4);
          std::endl<char,std::char_traits<char>>(poVar3);
          std::ostream::flush();
          goto LAB_0015ffe6;
        }
      }
    }
    lVar5 = lVar5 + 1;
  } while( true );
}

Assistant:

bool
checkPixels (Array2D<unsigned int>& sampleCount,
             Array2D<T*> &ph,
             int lx, int rx, int ly, int ry, int width)
{
    for (int y = ly; y <= ry; ++y)
    {
        for (int x = lx; x <= rx; ++x)
        {
            for (unsigned int i = 0; i < sampleCount[y][x]; i++)
            {
                if (ph[y][x][i] != static_cast<T>(((y * width + x) % 2049)))
                {
                    cout << "value at " << x << ", " << y << ", sample " << i << ": " << ph[y][x][i]
                         << ", should be " << (y * width + x) % 2049 << endl << flush;
                    return false;
                }
            }
        }
    }

    return true;
}